

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highwayhash.h
# Opt level: O3

void __thiscall
highwayhash::HighwayHashCatT<4U>::Finalize<unsigned_long>
          (HighwayHashCatT<4U> *this,unsigned_long *hash)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  uint uVar4;
  char *pcVar5;
  ulong uVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  V4x32U packetH;
  V4x32U packetL;
  undefined1 local_c0 [32];
  V4x64U local_a0;
  V4x64U local_80;
  V4x64U local_60;
  V4x32U local_40;
  V4x32U local_30;
  undefined1 auVar11 [32];
  
  local_c0 = *(undefined1 (*) [32])(this->state_).v0.v_;
  local_a0.v_ = *&(this->state_).v1.v_;
  local_80.v_ = *&(this->state_).mul0.v_;
  local_60.v_ = *&(this->state_).mul1.v_;
  uVar1 = this->buffer_usage_;
  if (uVar1 != 0) {
    uVar4 = (uint)uVar1;
    auVar10._4_4_ = uVar4;
    auVar10._0_4_ = uVar4;
    auVar10._8_4_ = uVar4;
    auVar10._12_4_ = uVar4;
    auVar11._16_4_ = uVar4;
    auVar11._0_16_ = auVar10;
    auVar11._20_4_ = uVar4;
    auVar11._24_4_ = uVar4;
    auVar11._28_4_ = uVar4;
    local_c0 = vpaddq_avx2(local_c0,auVar11);
    auVar12 = vpsllvd_avx2((undefined1  [32])local_a0.v_,auVar11);
    auVar13._8_4_ = 0x20;
    auVar13._0_8_ = 0x2000000020;
    auVar13._12_4_ = 0x20;
    auVar13._16_4_ = 0x20;
    auVar13._20_4_ = 0x20;
    auVar13._24_4_ = 0x20;
    auVar13._28_4_ = 0x20;
    auVar11 = vpsubd_avx2(auVar13,auVar11);
    auVar11 = vpsrlvd_avx2((undefined1  [32])local_a0.v_,auVar11);
    local_a0.v_ = (Intrinsic)vpor_avx2(auVar11,auVar12);
    pcVar5 = this->buffer_ + (uVar1 & 0xfffffffffffffffc);
    uVar6 = (ulong)(uVar4 & 3);
    if ((uVar1 & 0x10) == 0) {
      auVar10 = vpcmpgtd_avx(auVar10,_DAT_00113220);
      auVar10 = vpand_avx(auVar10,*(undefined1 (*) [16])this->buffer_);
      if (uVar6 == 0) {
        uVar4 = 0;
      }
      else {
        uVar4 = (uint)CONCAT12(pcVar5[uVar6 - 1],CONCAT11(pcVar5[(uVar4 & 3) >> 1],*pcVar5));
      }
      auVar12._0_16_ = ZEXT116(0) * ZEXT416(uVar4) + ZEXT116(1) * auVar10;
      auVar12._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * ZEXT416(uVar4);
      auVar11 = vpaddq_avx2((undefined1  [32])local_80.v_,(undefined1  [32])local_a0.v_);
      auVar11 = vpaddq_avx2(auVar11,auVar12);
      auVar12 = vpsrlq_avx2(local_c0,0x20);
      auVar12 = vpmuludq_avx2(auVar11,auVar12);
      local_80.v_ = auVar12 ^ local_80.v_;
      auVar12 = vpaddq_avx2((undefined1  [32])local_60.v_,local_c0);
      auVar13 = vpsrlq_avx2(auVar11,0x20);
      auVar13 = vpmuludq_avx2(auVar13,auVar12);
      local_60.v_ = auVar13 ^ local_60.v_;
      auVar7._16_16_ = _DAT_00113230;
      auVar7._0_16_ = _DAT_00113230;
      auVar13 = vpshufb_avx2(auVar11,auVar7);
      local_c0 = vpaddq_avx2(auVar12,auVar13);
      auVar12 = vpshufb_avx2(local_c0,auVar7);
      local_a0.v_ = (Intrinsic)vpaddq_avx2(auVar11,auVar12);
    }
    else {
      local_30.v_[0] = *(longlong *)this->buffer_;
      local_30.v_[1] = *(longlong *)(this->buffer_ + 8);
      auVar10 = vpcmpgtd_avx(auVar10,_DAT_00113210);
      auVar10 = vpand_avx(auVar10,*(undefined1 (*) [16])(this->buffer_ + 0x10));
      local_40.v_ = (Intrinsic)vpinsrd_avx(auVar10,*(undefined4 *)(pcVar5 + (uVar6 - 4)),3);
      AVX2::HHStateAVX2::Update((HHStateAVX2 *)local_c0,&local_40,&local_30);
    }
  }
  auVar11 = vpshufd_avx2(local_c0,0xb1);
  auVar12 = vpermq_avx2(auVar11,0x4e);
  auVar11 = vpaddq_avx2((undefined1  [32])local_a0.v_,(undefined1  [32])local_80.v_);
  auVar11 = vpaddq_avx2(auVar11,auVar12);
  auVar12 = vpsrlq_avx2(local_c0,0x20);
  auVar13 = vpmuludq_avx2(auVar11,auVar12);
  auVar12 = vpaddq_avx2((undefined1  [32])local_60.v_,local_c0);
  auVar7 = vpsrlq_avx2(auVar11,0x20);
  auVar7 = vpmuludq_avx2(auVar7,auVar12);
  auVar8._16_16_ = _DAT_00113230;
  auVar8._0_16_ = _DAT_00113230;
  auVar9 = vpshufb_avx2(auVar11,auVar8);
  auVar12 = vpaddq_avx2(auVar9,auVar12);
  auVar9 = vpshufb_avx2(auVar12,auVar8);
  auVar3 = vpshufd_avx2(auVar12,0xb1);
  auVar3 = vpermq_avx2(auVar3,0x4e);
  auVar11 = vpaddq_avx2(auVar13 ^ (undefined1  [32])local_80.v_,auVar11);
  auVar11 = vpaddq_avx2(auVar11,auVar9);
  auVar11 = vpaddq_avx2(auVar11,auVar3);
  auVar9 = vpsrlq_avx2(auVar12,0x20);
  auVar9 = vpmuludq_avx2(auVar11,auVar9);
  auVar9 = auVar9 ^ auVar13 ^ (undefined1  [32])local_80.v_;
  auVar12 = vpaddq_avx2(auVar7 ^ (undefined1  [32])local_60.v_,auVar12);
  auVar13 = vpsrlq_avx2(auVar11,0x20);
  auVar13 = vpmuludq_avx2(auVar13,auVar12);
  auVar13 = auVar13 ^ auVar7 ^ (undefined1  [32])local_60.v_;
  auVar7 = vpshufb_avx2(auVar11,auVar8);
  auVar12 = vpaddq_avx2(auVar7,auVar12);
  auVar7 = vpshufb_avx2(auVar12,auVar8);
  auVar3 = vpshufd_avx2(auVar12,0xb1);
  auVar3 = vpermq_avx2(auVar3,0x4e);
  auVar11 = vpaddq_avx2(auVar9,auVar11);
  auVar11 = vpaddq_avx2(auVar11,auVar7);
  auVar11 = vpaddq_avx2(auVar11,auVar3);
  auVar7 = vpsrlq_avx2(auVar12,0x20);
  auVar7 = vpmuludq_avx2(auVar11,auVar7);
  auVar7 = auVar7 ^ auVar9;
  auVar12 = vpaddq_avx2(auVar13,auVar12);
  auVar9 = vpsrlq_avx2(auVar11,0x20);
  auVar9 = vpmuludq_avx2(auVar9,auVar12);
  auVar9 = auVar9 ^ auVar13;
  auVar13 = vpshufb_avx2(auVar11,auVar8);
  auVar12 = vpaddq_avx2(auVar13,auVar12);
  auVar13 = vpshufb_avx2(auVar12,auVar8);
  auVar3 = vpshufd_avx2(auVar12,0xb1);
  auVar3 = vpermq_avx2(auVar3,0x4e);
  auVar11 = vpaddq_avx2(auVar7,auVar11);
  auVar11 = vpaddq_avx2(auVar11,auVar13);
  auVar11 = vpaddq_avx2(auVar11,auVar3);
  auVar13 = vpsrlq_avx2(auVar12,0x20);
  auVar13 = vpmuludq_avx2(auVar11,auVar13);
  local_80.v_[0] = auVar13._0_8_ ^ auVar7._0_8_;
  auVar12 = vpaddq_avx2(auVar9,auVar12);
  auVar13 = vpsrlq_avx2(auVar11,0x20);
  auVar13 = vpmuludq_avx2(auVar13,auVar12);
  local_60.v_[0] = auVar13._0_8_ ^ auVar9._0_8_;
  local_a0.v_._0_16_ = auVar11._0_16_;
  auVar10 = vpshufb_avx((undefined1  [16])local_a0.v_._0_16_,_DAT_00113230);
  local_c0._0_16_ = auVar12._0_16_;
  auVar10 = vpaddq_avx(auVar10,local_c0._0_16_);
  auVar2 = vpshufb_avx(auVar10,_DAT_00113230);
  auVar2 = vpaddq_avx(auVar2,(undefined1  [16])local_a0.v_._0_16_);
  *hash = auVar10._0_8_ + local_60.v_[0] + local_80.v_[0] + auVar2._0_8_;
  return;
}

Assistant:

HH_INLINE void Finalize(Result* HH_RESTRICT hash) const {
    // BeginIACA();
    HHStateT<Target> state_copy = state_;
    const size_t buffer_usage = buffer_usage_;
    if (HH_LIKELY(buffer_usage != 0)) {
      state_copy.UpdateRemainder(buffer_, buffer_usage);
    }
    state_copy.Finalize(hash);
    // EndIACA();
  }